

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O3

uint aom_highbd_obmc_sad4x8_c(uint8_t *ref,int ref_stride,int32_t *wsrc,int32_t *mask)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  ulong *puVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  puVar8 = (ulong *)((long)ref * 2);
  lVar9 = 0;
  uVar11 = 0;
  do {
    piVar1 = (int *)((long)wsrc + lVar9);
    auVar3 = *(undefined1 (*) [16])((long)mask + lVar9);
    uVar2 = *puVar8;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_2_ = (short)(uVar2 >> 0x30);
    auVar5._8_2_ = (short)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._10_4_ = auVar4._10_4_;
    auVar7._6_8_ = 0;
    auVar7._0_6_ = auVar5._8_6_;
    auVar6._4_2_ = (short)(uVar2 >> 0x10);
    auVar6._0_4_ = (uint)uVar2;
    auVar6._6_8_ = SUB148(auVar7 << 0x40,6);
    uVar10 = *piVar1 - auVar3._0_4_ * ((uint)uVar2 & 0xffff);
    uVar12 = piVar1[1] - auVar6._4_4_ * auVar3._4_4_;
    uVar13 = piVar1[2] - (int)((auVar3._8_8_ & 0xffffffff) * ((ulong)auVar5._8_6_ & 0xffffffff));
    uVar14 = piVar1[3] - (auVar4._10_4_ >> 0x10) * auVar3._12_4_;
    uVar15 = (int)uVar10 >> 0x1f;
    uVar16 = (int)uVar12 >> 0x1f;
    uVar17 = (int)uVar13 >> 0x1f;
    uVar18 = (int)uVar14 >> 0x1f;
    uVar11 = (((uVar14 ^ uVar18) - uVar18) + 0x800 >> 0xc) +
             (((uVar12 ^ uVar16) - uVar16) + 0x800 >> 0xc) +
             (((uVar13 ^ uVar17) - uVar17) + 0x800 >> 0xc) +
             (((uVar10 ^ uVar15) - uVar15) + 0x800 >> 0xc) + uVar11;
    puVar8 = (ulong *)((long)puVar8 + (long)ref_stride * 2);
    lVar9 = lVar9 + 0x10;
  } while ((int)lVar9 != 0x80);
  return uVar11;
}

Assistant:

static inline unsigned int highbd_obmc_sad(
                                const uint8_t *pre8, int pre_stride,
                                const int32_t *wsrc, const int32_t *mask,
                                int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++)
      sad += ROUND_POWER_OF_TWO(abs(wsrc[x] - pre[x] * mask[x]), 12);

    pre += pre_stride;
    wsrc += width;
    mask += width;
  }

  return sad;
}